

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  cmTest *pcVar7;
  ostream *poVar8;
  pointer pcVar9;
  string *psVar10;
  char *pcVar11;
  PolicyID id;
  bool local_419;
  bool local_3e1;
  bool local_3d2;
  bool local_3d1;
  bool local_3ab;
  bool local_3aa;
  bool local_392;
  bool local_37a;
  bool local_379;
  string local_370 [8];
  string env;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  byte local_321;
  ulong uStack_320;
  bool bdef;
  size_t argP1len;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [8];
  ostringstream e;
  allocator local_151;
  string local_150;
  cmTest *local_130;
  cmTest *haveTest;
  _Self local_120;
  PolicyID local_114;
  iterator iStack_110;
  PolicyID pid;
  allocator local_101;
  string local_100;
  cmCommand *local_e0;
  cmCommand *command;
  _Self local_d0;
  allocator local_c1;
  string local_c0;
  _Self local_a0 [3];
  allocator local_81;
  string local_80;
  _Self local_60;
  _Self local_58;
  _Self local_50;
  _List_iterator<cmExpandedCommandArgument> local_48;
  iterator argP2;
  iterator argP1;
  iterator arg;
  int reducible;
  MessageType *param_3_local;
  string *param_2_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    argP1 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                      (newArgs);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&argP2);
    std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_48);
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
           ::end(newArgs);
      bVar2 = std::operator!=(&argP1,&local_50);
      if (!bVar2) break;
      argP2 = argP1;
      IncrementArguments(this,newArgs,&argP2,&local_48);
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyEXISTS_abi_cxx11_,pcVar4);
      local_379 = false;
      if (bVar2) {
        local_58._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_379 = std::operator!=(&argP2,&local_58);
      }
      if (local_379 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmsys::SystemTools::FileExists(pcVar11);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyIS_DIRECTORY_abi_cxx11_,pcVar4);
      local_37a = false;
      if (bVar2) {
        local_60._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_37a = std::operator!=(&argP2,&local_60);
      }
      if (local_37a != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_80,pcVar11,&local_81);
        bVar2 = cmsys::SystemTools::FileIsDirectory(&local_80);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyIS_SYMLINK_abi_cxx11_,pcVar4);
      local_392 = false;
      if (bVar2) {
        local_a0[0]._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_392 = std::operator!=(&argP2,local_a0);
      }
      if (local_392 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c0,pcVar11,&local_c1);
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_c0);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyIS_ABSOLUTE_abi_cxx11_,pcVar4);
      local_3aa = false;
      if (bVar2) {
        local_d0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_3aa = std::operator!=(&argP2,&local_d0);
      }
      if (local_3aa != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar11);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyCOMMAND_abi_cxx11_,pcVar4);
      local_3ab = false;
      if (bVar2) {
        command = (cmCommand *)
                  std::__cxx11::
                  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                            (newArgs);
        local_3ab = std::operator!=(&argP2,(_Self *)&command);
      }
      if (local_3ab != false) {
        this_00 = cmMakefile::GetState(this->Makefile);
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_100,pcVar11,&local_101);
        pcVar5 = cmState::GetCommand(this_00,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
        local_e0 = pcVar5;
        HandlePredicate(this,pcVar5 != (cmCommand *)0x0,(int *)((long)&arg._M_node + 4),&argP1,
                        newArgs,&argP2,&local_48);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyPOLICY_abi_cxx11_,pcVar4);
      local_3d1 = false;
      if (bVar2) {
        iStack_110 = std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
        local_3d1 = std::operator!=(&argP2,&stack0xfffffffffffffef0);
      }
      if (local_3d1 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
        bVar2 = cmPolicies::GetPolicyID(pcVar11,&local_114);
        HandlePredicate(this,bVar2,(int *)((long)&arg._M_node + 4),&argP1,newArgs,&argP2,&local_48);
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyTARGET_abi_cxx11_,pcVar4);
      local_3d2 = false;
      if (bVar2) {
        local_120._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       (newArgs);
        local_3d2 = std::operator!=(&argP2,&local_120);
      }
      if (local_3d2 != false) {
        pcVar1 = this->Makefile;
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        pcVar6 = cmMakefile::FindTargetToUse(pcVar1,psVar10,false);
        HandlePredicate(this,pcVar6 != (cmTarget *)0x0,(int *)((long)&arg._M_node + 4),&argP1,
                        newArgs,&argP2,&local_48);
      }
      if ((this->Policy64Status == OLD) || (this->Policy64Status == WARN)) {
        if (this->Policy64Status == WARN) {
          pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
          bVar2 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar4);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2f0,(cmPolicies *)0x40,id);
            poVar8 = std::operator<<((ostream *)local_2d0,(string *)&local_2f0);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_2f0);
            std::operator<<((ostream *)local_2d0,
                            "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar1 = this->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_310);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
          }
        }
      }
      else {
        pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
        bVar2 = IsKeyword(this,&keyTEST_abi_cxx11_,pcVar4);
        local_3e1 = false;
        if (bVar2) {
          haveTest = (cmTest *)
                     std::__cxx11::
                     list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                     end(newArgs);
          local_3e1 = std::operator!=(&argP2,(_Self *)&haveTest);
        }
        if (local_3e1 != false) {
          pcVar1 = this->Makefile;
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          pcVar11 = cmExpandedCommandArgument::c_str(pcVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_150,pcVar11,&local_151);
          pcVar7 = cmMakefile::GetTest(pcVar1,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
          local_130 = pcVar7;
          HandlePredicate(this,pcVar7 != (cmTest *)0x0,(int *)((long)&arg._M_node + 4),&argP1,
                          newArgs,&argP2,&local_48);
        }
      }
      pcVar4 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&argP1);
      bVar2 = IsKeyword(this,&keyDEFINED_abi_cxx11_,pcVar4);
      local_419 = false;
      if (bVar2) {
        argP1len = (size_t)std::__cxx11::
                           list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ::end(newArgs);
        local_419 = std::operator!=(&argP2,(_Self *)&argP1len);
      }
      if (local_419 != false) {
        pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
        cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
        uStack_320 = std::__cxx11::string::size();
        local_321 = 0;
        env.field_2._M_local_buf[0xf] = '\0';
        bVar2 = false;
        if (4 < uStack_320) {
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          std::__cxx11::string::substr((ulong)&local_348,(ulong)psVar10);
          env.field_2._M_local_buf[0xf] = '\x01';
          bVar3 = std::operator==(&local_348,"ENV{");
          bVar2 = false;
          if (bVar3) {
            pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
            psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
            pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)psVar10);
            bVar2 = *pcVar11 == '}';
          }
        }
        if ((env.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_348);
        }
        if (bVar2) {
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          std::__cxx11::string::substr((ulong)local_370,(ulong)psVar10);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          local_321 = cmsys::SystemTools::HasEnv(pcVar11);
          std::__cxx11::string::~string(local_370);
        }
        else {
          pcVar1 = this->Makefile;
          pcVar9 = std::_List_iterator<cmExpandedCommandArgument>::operator->(&argP2);
          psVar10 = cmExpandedCommandArgument::GetValue_abi_cxx11_(pcVar9);
          local_321 = cmMakefile::IsDefinitionSet(pcVar1,psVar10);
        }
        HandlePredicate(this,(bool)(local_321 & 1),(int *)((long)&arg._M_node + 4),&argP1,newArgs,
                        &argP2,&local_48);
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&argP1);
    }
  } while (arg._M_node._4_4_ != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        cmake::MessageType&)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      this->IncrementArguments(newArgs, argP1, argP2);
      // does a file exist
      if (this->IsKeyword(keyEXISTS, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileExists(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a directory with this name exist
      if (this->IsKeyword(keyIS_DIRECTORY, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsDirectory(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a symlink with this name exist
      if (this->IsKeyword(keyIS_SYMLINK, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsSymlink(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // is the given path an absolute path ?
      if (this->IsKeyword(keyIS_ABSOLUTE, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(cmSystemTools::FileIsFullPath(argP1->c_str()),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a command exist
      if (this->IsKeyword(keyCOMMAND, *arg) && argP1 != newArgs.end()) {
        cmCommand* command =
          this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(command != CM_NULLPTR, reducible, arg, newArgs,
                              argP1, argP2);
      }
      // does a policy exist
      if (this->IsKeyword(keyPOLICY, *arg) && argP1 != newArgs.end()) {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(cmPolicies::GetPolicyID(argP1->c_str(), pid),
                              reducible, arg, newArgs, argP1, argP2);
      }
      // does a target exist
      if (this->IsKeyword(keyTARGET, *arg) && argP1 != newArgs.end()) {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue()) != CM_NULLPTR,
          reducible, arg, newArgs, argP1, argP2);
      }
      // does a test exist
      if (this->Policy64Status != cmPolicies::OLD &&
          this->Policy64Status != cmPolicies::WARN) {
        if (this->IsKeyword(keyTEST, *arg) && argP1 != newArgs.end()) {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(haveTest != CM_NULLPTR, reducible, arg,
                                newArgs, argP1, argP2);
        }
      } else if (this->Policy64Status == cmPolicies::WARN &&
                 this->IsKeyword(keyTEST, *arg)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      // is a variable defined
      if (this->IsKeyword(keyDEFINED, *arg) && argP1 != newArgs.end()) {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if (argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
            argP1->GetValue().operator[](argP1len - 1) == '}') {
          std::string env = argP1->GetValue().substr(4, argP1len - 5);
          bdef = cmSystemTools::HasEnv(env.c_str());
        } else {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
        }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}